

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall
RPCExamples::ToDescriptionString_abi_cxx11_(string *__return_storage_ptr__,RPCExamples *this)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_examples)._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->m_examples)._M_dataplus._M_p;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00db5b12;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00db5b12:
      __stack_chk_fail();
    }
    std::operator+(__return_storage_ptr__,"\nExamples:\n",&this->m_examples);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RPCExamples::ToDescriptionString() const
{
    return m_examples.empty() ? m_examples : "\nExamples:\n" + m_examples;
}